

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndChild(void)

{
  float fVar1;
  ImGuiNavHighlightFlags in_stack_00000018;
  ImGuiID in_stack_0000001c;
  ImRect *in_stack_00000020;
  ImRect bb;
  ImGuiWindow *parent_window;
  ImVec2 sz;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff68;
  ImRect *in_stack_ffffffffffffff88;
  ImVec2 *min;
  ImGuiID id;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImVec2 local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = GImGui->CurrentWindow;
  if ((GImGui->WithinEndChild & 1U) != 0) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x12c8,"void ImGui::EndChild()");
  }
  if ((local_10->Flags & 0x1000000U) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x12c9,"void ImGui::EndChild()");
  }
  GImGui->WithinEndChild = true;
  if (local_10->BeginCount < 2) {
    local_18 = local_10->Size;
    if ((local_10->AutoFitChildAxises & 1U) != 0) {
      fVar1 = ImMax<float>(4.0,local_18.x);
      local_18.x = fVar1;
    }
    if ((local_10->AutoFitChildAxises & 2U) != 0) {
      fVar1 = ImMax<float>(4.0,local_18.y);
      local_18.y = fVar1;
    }
    End();
    local_20 = local_8->CurrentWindow;
    min = &(local_20->DC).CursorPos;
    local_38 = operator+(in_stack_ffffffffffffff68,(ImVec2 *)0x183ac0);
    ImRect::ImRect(&local_30,min,&local_38);
    ItemSize(min,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    id = (ImGuiID)((ulong)min >> 0x20);
    if ((((local_10->DC).NavLayerActiveMask == 0) && (((local_10->DC).NavHasScroll & 1U) == 0)) ||
       ((local_10->Flags & 0x800000U) != 0)) {
      ItemAdd((ImRect *)in_stack_ffffffffffffff98,id,in_stack_ffffffffffffff88);
    }
    else {
      ItemAdd((ImRect *)in_stack_ffffffffffffff98,id,in_stack_ffffffffffffff88);
      RenderNavHighlight(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      if (((local_10->DC).NavLayerActiveMask == 0) && (local_10 == local_8->NavWindow)) {
        ImVec2::ImVec2(&local_58,2.0,2.0);
        local_50 = operator-(in_stack_ffffffffffffff68,(ImVec2 *)0x183bc2);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,2.0,2.0);
        local_60 = operator+(in_stack_ffffffffffffff68,(ImVec2 *)0x183bf9);
        ImRect::ImRect(&local_48,&local_50,&local_60);
        RenderNavHighlight(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      }
    }
  }
  else {
    End();
  }
  local_8->WithinEndChild = false;
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2,2), bb.Max + ImVec2(2,2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
}